

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

ON_ModelComponentReference __thiscall
ONX_Model::AddManagedModelGeometryComponent
          (ONX_Model *this,ON_Object *managed_geometry_object,
          ON_3dmObjectAttributes *managed_attributes,bool bResolveIdAndNameConflicts)

{
  ON_Geometry *pOVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ON_ModelComponentReference OVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  pOVar1 = ON_Geometry::Cast(&managed_attributes->super_ON_Object);
  if (pOVar1 == (ON_Geometry *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
               ,0x64c,"","Invalid managed_geometry_object parameter.");
    ON_ModelComponentReference::ON_ModelComponentReference
              ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    OVar3 = AddModelGeometryComponentForExperts
                      (this,SUB81(managed_geometry_object,0),(ON_Object *)0x1,
                       SUB81(managed_attributes,0),(ON_3dmObjectAttributes *)0x1,
                       bResolveIdAndNameConflicts);
    _Var2._M_pi = OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::AddManagedModelGeometryComponent(
  class ON_Object* managed_geometry_object,
  class ON_3dmObjectAttributes* managed_attributes,
  bool bResolveIdAndNameConflicts
)
{
  if ( nullptr == ON_Geometry::Cast(managed_geometry_object) )
  {
    ON_ERROR("Invalid managed_geometry_object parameter.");
    return ON_ModelComponentReference::Empty;
  }
  const bool bManageGeometry = true;
  const bool bManageAttributes = true;
  return AddModelGeometryComponentForExperts(
    bManageGeometry,
    managed_geometry_object,
    bManageAttributes,
    managed_attributes,
    bResolveIdAndNameConflicts
  );
}